

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::quatd> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::quatd>
          (optional<tinyusdz::value::quatd> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::quatd> local_40;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<tinyusdz::value::quatd>(&local_40,&this->_var);
  nonstd::optional_lite::optional<tinyusdz::value::quatd>::optional<tinyusdz::value::quatd,_0>
            (__return_storage_ptr__,&local_40);
  nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional(&local_40);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }